

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O2

uchar med3char<unsigned_char>(uchar a,uchar b,uchar c)

{
  uchar uVar1;
  
  uVar1 = a;
  if (a != b) {
    if (c == b || c == a) {
      return c;
    }
    uVar1 = b;
    if (a < b) {
      if (c <= b) {
        if (c < a) {
          c = a;
        }
        return c;
      }
    }
    else if (b <= c) {
      if (a < c) {
        c = a;
      }
      return c;
    }
  }
  return uVar1;
}

Assistant:

CharT
med3char(CharT a, CharT b, CharT c)
{
	if (a == b)           return a;
	if (c == a || c == b) return c;
	if (a < b) {
		if (b < c) return b;
		if (a < c) return c;
		return a;
	}
	if (b > c) return b;
	if (a < c) return a;
	return c;
}